

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.hpp
# Opt level: O0

TestNodeClass tcu::getTestNodeTypeClass(TestNodeType type)

{
  TestNodeClass local_c;
  TestNodeType type_local;
  
  switch(type) {
  case NODETYPE_ROOT:
    local_c = NODECLASS_GROUP;
    break;
  case NODETYPE_PACKAGE:
    local_c = NODECLASS_GROUP;
    break;
  case NODETYPE_GROUP:
    local_c = NODECLASS_GROUP;
    break;
  case NODETYPE_SELF_VALIDATE:
    local_c = NODECLASS_EXECUTABLE;
    break;
  case NODETYPE_PERFORMANCE:
    local_c = NODECLASS_EXECUTABLE;
    break;
  case NODETYPE_CAPABILITY:
    local_c = NODECLASS_EXECUTABLE;
    break;
  case NODETYPE_ACCURACY:
    local_c = NODECLASS_EXECUTABLE;
    break;
  default:
    local_c = NODECLASS_LAST;
  }
  return local_c;
}

Assistant:

inline TestNodeClass getTestNodeTypeClass (TestNodeType type)
{
	switch (type)
	{
		case NODETYPE_ROOT:				return NODECLASS_GROUP;
		case NODETYPE_PACKAGE:			return NODECLASS_GROUP;
		case NODETYPE_GROUP:			return NODECLASS_GROUP;
		case NODETYPE_SELF_VALIDATE:	return NODECLASS_EXECUTABLE;
		case NODETYPE_PERFORMANCE:		return NODECLASS_EXECUTABLE;
		case NODETYPE_CAPABILITY:		return NODECLASS_EXECUTABLE;
		case NODETYPE_ACCURACY:			return NODECLASS_EXECUTABLE;
		default:
			DE_ASSERT(false);
			return NODECLASS_LAST;
	}
}